

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGFree(xmlRelaxNGPtr schema)

{
  int local_14;
  int i;
  xmlRelaxNGPtr schema_local;
  
  if (schema != (xmlRelaxNGPtr)0x0) {
    if (schema->topgrammar != (xmlRelaxNGGrammarPtr_conflict)0x0) {
      xmlRelaxNGFreeGrammar(schema->topgrammar);
    }
    if (schema->doc != (xmlDocPtr)0x0) {
      xmlFreeDoc(schema->doc);
    }
    if (schema->documents != (xmlRelaxNGDocumentPtr_conflict)0x0) {
      xmlRelaxNGFreeDocumentList(schema->documents);
    }
    if (schema->includes != (xmlRelaxNGIncludePtr_conflict)0x0) {
      xmlRelaxNGFreeIncludeList(schema->includes);
    }
    if (schema->defTab != (xmlRelaxNGDefinePtr_conflict *)0x0) {
      for (local_14 = 0; local_14 < schema->defNr; local_14 = local_14 + 1) {
        xmlRelaxNGFreeDefine(schema->defTab[local_14]);
      }
      (*xmlFree)(schema->defTab);
    }
    (*xmlFree)(schema);
  }
  return;
}

Assistant:

void
xmlRelaxNGFree(xmlRelaxNGPtr schema)
{
    if (schema == NULL)
        return;

    if (schema->topgrammar != NULL)
        xmlRelaxNGFreeGrammar(schema->topgrammar);
    if (schema->doc != NULL)
        xmlFreeDoc(schema->doc);
    if (schema->documents != NULL)
        xmlRelaxNGFreeDocumentList(schema->documents);
    if (schema->includes != NULL)
        xmlRelaxNGFreeIncludeList(schema->includes);
    if (schema->defTab != NULL) {
        int i;

        for (i = 0; i < schema->defNr; i++)
            xmlRelaxNGFreeDefine(schema->defTab[i]);
        xmlFree(schema->defTab);
    }

    xmlFree(schema);
}